

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall pbrt::ScratchBuffer::ScratchBuffer(ScratchBuffer *this,ScratchBuffer *b)

{
  undefined8 *in_RSI;
  list<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_> *in_RDI
  ;
  list<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>
  *unaff_retaddr;
  list<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_> *__x;
  
  (in_RDI->
  super__List_base<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  *(undefined4 *)
   &(in_RDI->
    super__List_base<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = 0;
  *(undefined4 *)
   ((long)&(in_RDI->
           super__List_base<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev + 4) = 0;
  __x = in_RDI;
  std::__cxx11::
  list<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>::list
            ((list<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>
              *)0x96db35);
  (in_RDI->
  super__List_base<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)*in_RSI;
  *(undefined4 *)
   &(in_RDI->
    super__List_base<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = *(undefined4 *)(in_RSI + 1);
  *(undefined4 *)
   ((long)&(in_RDI->
           super__List_base<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev + 4) =
       *(undefined4 *)((long)in_RSI + 0xc);
  std::__cxx11::
  list<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>::
  operator=(unaff_retaddr,__x);
  *in_RSI = 0;
  *(undefined4 *)((long)in_RSI + 0xc) = 0;
  *(undefined4 *)(in_RSI + 1) = 0;
  return;
}

Assistant:

ScratchBuffer(ScratchBuffer &&b) {
        ptr = b.ptr;
        allocSize = b.allocSize;
        offset = b.offset;
        smallBuffers = std::move(b.smallBuffers);

        b.ptr = nullptr;
        b.allocSize = b.offset = 0;
    }